

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ProceduralDeassignStatementSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  
  return (kind | TokenList) == ProceduralReleaseStatement;
}

Assistant:

bool ProceduralDeassignStatementSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ProceduralDeassignStatement:
        case SyntaxKind::ProceduralReleaseStatement:
            return true;
        default:
            return false;
    }
}